

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O1

void __thiscall
Test_Template_TemplateNamelist::Test_Template_TemplateNamelist(Test_Template_TemplateNamelist *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  if (g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void(*)(),std::allocator<void(*)()>>::_M_realloc_insert<void(*)()>
              ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,
               (iterator)
               g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_8);
  }
  else {
    *g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
     super__Vector_impl_data._M_finish = Run;
    g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
    super__Vector_impl_data._M_finish =
         g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  return;
}

Assistant:

TEST(Template, TemplateNamelist) {
  time_t before_time = Now();   // in template_test_util.cc
  string f1 = StringToTemplateFile("{{This has spaces in it}}");
  string f2 = StringToTemplateFile("{{#SEC}}foo");
  string f3 = StringToTemplateFile("{This is ok");
  // Where we'll copy f1 - f3 to: these are names known at compile-time
  string f1_copy = PathJoin(FLAGS_test_tmpdir, INVALID1_FN);
  string f2_copy = PathJoin(FLAGS_test_tmpdir, INVALID2_FN);
  string f3_copy = PathJoin(FLAGS_test_tmpdir, VALID1_FN);
  Template::SetTemplateRootDirectory(FLAGS_test_tmpdir);
  time_t after_time = Now();   // f1, f2, f3 all written by now

  TemplateNamelist::NameListType names = TemplateNamelist::GetList();
  ASSERT(names.size() == 4);
  ASSERT(names.count(NONEXISTENT_FN));
  ASSERT(names.count(INVALID1_FN));
  ASSERT(names.count(INVALID2_FN));
  ASSERT(names.count(VALID1_FN));

  // Before creating the files INVALID1_FN, etc., all should be missing.
  for (int i = 0; i < 3; ++i) {   // should be consistent all 3 times
    const TemplateNamelist::MissingListType& missing =
        TemplateNamelist::GetMissingList(false);
    ASSERT(missing.size() == 4);
  }
  // Everyone is missing, but nobody should have bad syntax
  ASSERT(!TemplateNamelist::AllDoExist());
  ASSERT(TemplateNamelist::IsAllSyntaxOkay(DO_NOT_STRIP));

  // Now create those files
  ASSERT(link(f1.c_str(), f1_copy.c_str()) == 0);
  ASSERT(link(f2.c_str(), f2_copy.c_str()) == 0);
  ASSERT(link(f3.c_str(), f3_copy.c_str()) == 0);
  // We also have to clear the template cache, since we created a new file.
  // ReloadAllIfChanged() would probably work, too.
  Template::ClearCache();

  // When GetMissingList is false, we don't reload, so you still get all-gone
  TemplateNamelist::MissingListType missing =
      TemplateNamelist::GetMissingList(false);
  ASSERT(missing.size() == 4);
  // But with true, we should have a different story
  missing = TemplateNamelist::GetMissingList(true);
  ASSERT(missing.size() == 1);
  missing = TemplateNamelist::GetMissingList(false);
  ASSERT(missing.size() == 1);
  ASSERT(missing[0] == NONEXISTENT_FN);
  ASSERT(!TemplateNamelist::AllDoExist());

  // IsAllSyntaxOK did a badsyntax check, before the files were created.
  // So with a false arg, should still say everything is ok
  TemplateNamelist::SyntaxListType badsyntax =
      TemplateNamelist::GetBadSyntaxList(false, DO_NOT_STRIP);
  ASSERT(badsyntax.size() == 0);
  // But IsAllSyntaxOK forces a refresh
  ASSERT(!TemplateNamelist::IsAllSyntaxOkay(DO_NOT_STRIP));
  badsyntax = TemplateNamelist::GetBadSyntaxList(false, DO_NOT_STRIP);
  ASSERT(badsyntax.size() == 2);
  ASSERT(badsyntax[0] == INVALID1_FN || badsyntax[1] == INVALID1_FN);
  ASSERT(badsyntax[0] == INVALID2_FN || badsyntax[1] == INVALID2_FN);
  ASSERT(!TemplateNamelist::IsAllSyntaxOkay(DO_NOT_STRIP));
  badsyntax = TemplateNamelist::GetBadSyntaxList(true, DO_NOT_STRIP);
  ASSERT(badsyntax.size() == 2);

  time_t modtime = TemplateNamelist::GetLastmodTime();
  ASSERT(modtime >= before_time && modtime <= after_time);
  // Now update a file and make sure lastmod time is updated.
  // Note that since TemplateToFile uses "fake" timestamps way
  // in the past, this append should definitely give a time
  // that's after after_time.
  FILE* fp = fopen(f1_copy.c_str(), "ab");
  ASSERT(fp);
  fwrite("\n", 1, 1, fp);
  fclose(fp);
  modtime = TemplateNamelist::GetLastmodTime();
  ASSERT(modtime > after_time);

  // Checking if we can register templates at run time.
  string f4 = StringToTemplateFile("{{ONE_GOOD_TEMPLATE}}");
  TemplateNamelist::RegisterTemplate(f4.c_str());
  names = TemplateNamelist::GetList();
  ASSERT(names.size() == 5);

  string f5 = StringToTemplateFile("{{ONE BAD TEMPLATE}}");
  TemplateNamelist::RegisterTemplate(f5.c_str());
  names = TemplateNamelist::GetList();
  ASSERT(names.size() == 6);
  badsyntax = TemplateNamelist::GetBadSyntaxList(false, DO_NOT_STRIP);
  ASSERT(badsyntax.size() == 2);  // we did not refresh the bad syntax list
  badsyntax = TemplateNamelist::GetBadSyntaxList(true, DO_NOT_STRIP);
  // After refresh, the file we just registerd also added in bad syntax list
  ASSERT(badsyntax.size() == 3);

  TemplateNamelist::RegisterTemplate("A_non_existant_file.tpl");
  names = TemplateNamelist::GetList();
  ASSERT(names.size() == 7);
  missing = TemplateNamelist::GetMissingList(false);
  ASSERT(missing.size() == 1);  // we did not refresh the missing list
  missing = TemplateNamelist::GetMissingList(true);
  // After refresh, the file we just registerd also added in missing list
  ASSERT(missing.size() == 2);
}